

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::set_inc_term_func(raft_server *this,inc_term_func *func)

{
  bool bVar1;
  function<unsigned_long_(unsigned_long)> *in_RSI;
  function<unsigned_long_(unsigned_long)> *in_RDI;
  unique_lock<std::recursive_mutex> guard;
  inc_term_func *in_stack_ffffffffffffff88;
  element_type *in_stack_ffffffffffffff90;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)in_stack_ffffffffffffff88);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&in_RDI[0x16].super__Function_base._M_manager);
  if (bVar1) {
    in_stack_ffffffffffffff90 =
         std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x4c3f8e);
    std::function<unsigned_long_(unsigned_long)>::function(in_RDI,in_RSI);
    srv_state::set_inc_term_func(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::function<unsigned_long_(unsigned_long)>::~function
              ((function<unsigned_long_(unsigned_long)> *)0x4c3fbf);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void raft_server::set_inc_term_func(srv_state::inc_term_func func) {
    recur_lock(lock_);
    if (!state_) return;
    state_->set_inc_term_func(func);
}